

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O3

void __thiscall MessageCracker::~MessageCracker(MessageCracker *this)

{
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_0013ed38;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_0013ef80;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_0013f170;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_0013f480;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_0013f8f0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_0013fef0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_001404f0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_00140bb0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__MessageCracker_001415a0;
  std::
  _Rb_tree<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::_Identity<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
  ::~_Rb_tree(&(this->m_orderIDs)._M_t);
  operator_delete(this,0x78);
  return;
}

Assistant:

void process(const FIX::Message &message, const FIX::SessionID &sessionID) {
    FIX::Message echo = message;
    FIX::PossResend possResend(false);
    message.getHeader().getFieldIfSet(possResend);

    auto const &clOrdID = message.getField<FIX::ClOrdID>();

    std::pair<FIX::ClOrdID, FIX::SessionID> pair = std::make_pair(clOrdID, sessionID);

    if (possResend == true) {
      if (m_orderIDs.find(pair) != m_orderIDs.end()) {
        return;
      }
    }
    m_orderIDs.insert(pair);
    FIX::Session::sendToTarget(echo, sessionID);
  }